

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSpace::~IfcSpace(IfcSpace *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0x58 = 0x91caa0
  ;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x40 = 0x91cb90;
  *(undefined8 *)
   &this[-1].super_IfcSpatialStructureElement.super_IfcProduct.super_IfcObject.field_0xe0 = 0x91cac8
  ;
  this[-1].super_IfcSpatialStructureElement.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x91caf0;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x128 = 0x91cb18;
  *(undefined8 *)&this[-1].super_IfcSpatialStructureElement.field_0x158 = 0x91cb40;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0x91cb68;
  puVar1 = *(undefined1 **)
            &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            ((IfcSpatialStructureElement *)this_00,&PTR_construction_vtable_24__0091cba8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcSpace() : Object("IfcSpace") {}